

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall cmsys::CommandLineArguments::ProcessArgument(CommandLineArguments *this,char *arg)

{
  Internal *this_00;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  this_00 = this->Internals;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,arg,&local_31);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this_00,(String *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void CommandLineArguments::ProcessArgument(const char* arg)
{
  this->Internals->Argv.push_back(arg);
}